

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Parser::parseJson(Parser *this)

{
  int iVar1;
  
  skipWhiteSpace(this,"Expecting item");
  iVar1 = consume(this);
  if (iVar1 < 0) {
    return;
  }
  if (iVar1 == 0x22) {
    parseString(this);
    return;
  }
  if (iVar1 == 0x5b) {
    parseArray(this);
    return;
  }
  if (iVar1 != 0x66) {
    if (iVar1 == 0x6e) {
      parseNull(this);
      return;
    }
    if (iVar1 != 0x74) {
      if (iVar1 == 0x7b) {
        parseObject(this);
        return;
      }
      this->_pos = this->_pos - 1;
      parseNumber(this);
      return;
    }
    parseTrue(this);
    return;
  }
  parseFalse(this);
  return;
}

Assistant:

void Parser::parseJson() {
  skipWhiteSpace("Expecting item");  // return value intentionally not checked

  int i = consume();
  if (i < 0) {
    return;
  }
  switch (i) {
    case '{':
      parseObject();  // this consumes the closing '}' or throws
      break;
    case '[':
      parseArray();  // this consumes the closing ']' or throws
      break;
    case 't':
      parseTrue();  // this consumes "rue" or throws
      break;
    case 'f':
      parseFalse();  // this consumes "alse" or throws
      break;
    case 'n':
      parseNull();  // this consumes "ull" or throws
      break;
    case '"':
      parseString();
      break;
    default: {
      // everything else must be a number or is invalid...
      // this includes '-' and '0' to '9'. scanNumber() will
      // throw if the input is non-numeric
      unconsume();
      parseNumber();  // this consumes the number or throws
      break;
    }
  }
}